

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeSolutionHDivT<double>
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZMaterialDataT<double> *data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  TPZManVector<double,_10> *pTVar4;
  TPZFNMatrix<30,_double> *pTVar5;
  TNode *pTVar6;
  double *pdVar7;
  uint uVar8;
  int iVar9;
  long *plVar10;
  TPZCompMesh *pTVar11;
  TPZFMatrix<double> *pTVar12;
  Fad<double> *pFVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int j;
  long lVar20;
  ulong uVar21;
  int ilinha;
  int i;
  TPZManVector<double,_3> normal;
  TPZFMatrix<double> GradOfPhiHdiv;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  long local_12d0;
  long local_12c0;
  long local_12b0;
  long local_1298;
  ulong local_1288;
  long local_1260;
  TPZManVector<double,_3> local_1208 [3];
  TPZFMatrix<double> local_1150;
  double local_10c0 [4];
  TPZFMatrix<double> local_10a0;
  TPZManVector<TPZFNMatrix<9,_double>,_18> local_1010;
  
  plVar10 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  uVar8 = (**(code **)(*plVar10 + 0x78))(plVar10);
  iVar9 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  pTVar11 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar12 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar11->fSolution);
  if ((pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol != 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x24e);
  }
  TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->sol,1);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize(&data->dsol,1);
  TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->divsol,1);
  lVar20 = 0;
  lVar17 = 0;
  lVar19 = 1;
  do {
    pTVar4 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
    (**(code **)(*(long *)((long)pTVar4->fExtAlloc + lVar17 + -0x20) + 0x18))
              ((long)pTVar4->fExtAlloc + lVar17 + -0x20,(long)(int)(uVar8 * 3));
    local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
               lVar17 + -0x20),(double *)&local_1010,0,-1);
    pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
    (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                   (&((TPZFMatrix<double> *)
                                     (&(pTVar5->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1
                                   ))->fPivot + 0xffffffffffffffff) + lVar20) + 0x70))
              ((long)(&((TPZFMatrix<double> *)
                       (&((TPZFMatrix<double> *)(&(pTVar5->super_TPZFMatrix<double>).fPivot + -1))->
                         fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar20,(long)(int)(uVar8 * 3)
               ,3);
    pTVar4 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
    (**(code **)(*(long *)((long)pTVar4->fExtAlloc + lVar17 + -0x20) + 0x18))
              ((long)pTVar4->fExtAlloc + lVar17 + -0x20,(long)(int)uVar8);
    local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
               lVar17 + -0x20),(double *)&local_1010,0,-1);
    lVar17 = lVar17 + 0x70;
    lVar20 = lVar20 + 0x188;
    lVar19 = lVar19 + -1;
  } while (lVar19 != 0);
  local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_10a0.fElem = (double *)0x0;
  local_10a0.fGiven = (double *)0x0;
  local_10a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_10a0.fPivot.super_TPZVec<int>,0);
  local_10a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_10a0.fPivot.super_TPZVec<int>.fStore = local_10a0.fPivot.fExtAlloc;
  local_10a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_10a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_10a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_10a0.fWork.fStore = (double *)0x0;
  local_10a0.fWork.fNElements = 0;
  local_10a0.fWork.fNAlloc = 0;
  local_10a0.fElem = (double *)operator_new__(0x48);
  memset(local_10a0.fElem,0,
         local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  lVar19 = (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  lVar17 = (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  local_1150.fElem = local_10c0;
  local_1150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018454a8;
  local_1150.fSize = 3;
  local_1150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar19;
  local_1150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar17;
  local_1150.fGiven = local_1150.fElem;
  TPZVec<int>::TPZVec(&local_1150.fPivot.super_TPZVec<int>,0);
  local_1150.fPivot.super_TPZVec<int>.fStore = local_1150.fPivot.fExtAlloc;
  local_1150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1150.fWork.fStore = (double *)0x0;
  local_1150.fWork.fNElements = 0;
  local_1150.fWork.fNAlloc = 0;
  uVar21 = lVar19 * lVar17;
  if (uVar21 == 0) {
    local_1150.fElem = (double *)0x0;
  }
  else if (3 < (long)uVar21) {
    local_1150.fElem = (double *)operator_new__(-(ulong)(uVar21 >> 0x3d != 0) | uVar21 * 8);
  }
  local_1150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018451b8;
  TPZFMatrix<double>::operator=(&local_1150,0.0);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector(&local_1010,lVar17);
  if (0 < local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fNElements) {
    lVar19 = 0;
    lVar17 = 0;
    do {
      (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                     (&((TPZFMatrix<double> *)
                                       (&((local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)
                                         ->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->
                                     fPivot + 0xffffffffffffffff) + lVar19) + 0x70))
                ((long)(&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)
                           (&((local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)->
                             super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->fPivot +
                       0xffffffffffffffff) + lVar19,3,3);
      lVar17 = lVar17 + 1;
      lVar19 = lVar19 + 0xe0;
    } while (lVar17 < local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fNElements);
  }
  if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad != false) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x26c);
  }
  TPZFMatrix<double>::operator=
            (&local_1150,&(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>
            );
  pTVar11 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (0 < iVar9) {
    iVar18 = 0;
    local_1298 = 0;
    local_12c0 = 0;
    local_12d0 = 0;
    do {
      lVar19 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar18);
      pTVar6 = (pTVar11->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      uVar21 = (long)pTVar6[*(int *)(lVar19 + 8)].dim / (long)(int)uVar8;
      if (0 < (int)uVar21) {
        iVar3 = pTVar6[*(int *)(lVar19 + 8)].pos;
        local_1298 = (long)(int)local_1298;
        local_12c0 = (long)(int)local_12c0;
        local_12d0 = (long)(int)local_12d0;
        local_1260 = local_12c0 * 8;
        local_1288 = 0;
        do {
          local_12b0 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar16 = 0;
              do {
                lVar19 = local_1288 * (long)(int)uVar8 + (long)iVar3 + uVar16;
                if (((lVar19 < 0) ||
                    (lVar17 = (pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar17 <= lVar19)) ||
                   ((pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_12b0)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar1 = pTVar12->fElem[lVar17 * local_12b0 + lVar19];
                if (((local_12d0 < 0) ||
                    ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                     super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= local_12d0)) ||
                   ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                    super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar2 = (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.fElem[local_12d0]
                ;
                TPZManVector<double,_3>::TPZManVector(local_1208,3);
                lVar19 = 0;
                lVar17 = 0;
                do {
                  if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                    lVar20 = (data->super_TPZMaterialData).fDeformedDirectionsFad.
                             super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
                    if (((lVar20 <= lVar17) || (local_12c0 < 0)) ||
                       ((data->super_TPZMaterialData).fDeformedDirectionsFad.
                        super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= local_12c0)) {
                      TPZFMatrix<Fad<double>_>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    pFVar13 = (data->super_TPZMaterialData).fDeformedDirectionsFad.fElem +
                              lVar20 * local_12c0 + lVar17;
                  }
                  else {
                    lVar20 = (data->super_TPZMaterialData).fDeformedDirections.
                             super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                             fRow;
                    if (((lVar20 <= lVar17) || (local_12c0 < 0)) ||
                       ((data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                        super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= local_12c0)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    pFVar13 = (Fad<double> *)
                              ((long)(data->super_TPZMaterialData).fDeformedDirections.
                                     super_TPZFMatrix<double>.fElem + lVar19 + lVar20 * local_1260);
                  }
                  *(double *)((long)local_1208[0].super_TPZVec<double>.fStore + lVar19) =
                       pFVar13->val_;
                  lVar17 = lVar17 + 1;
                  lVar19 = lVar19 + 8;
                } while (lVar17 != 3);
                if (((local_1298 < 0) ||
                    ((data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>.
                     super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= local_1298)) ||
                   ((data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>.
                    super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar7 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore[local_12b0].
                         super_TPZVec<double>.fStore;
                pdVar7[uVar16] =
                     (data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>.fElem[local_1298]
                     * dVar1 + pdVar7[uVar16];
                lVar19 = 0;
                do {
                  lVar17 = lVar19 + uVar16 * 3;
                  pdVar7 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore[local_12b0].
                           super_TPZVec<double>.fStore;
                  pdVar7[lVar17] =
                       local_1208[0].super_TPZVec<double>.fStore[lVar19] * dVar2 * dVar1 +
                       pdVar7[lVar17];
                  lVar20 = 0;
                  do {
                    if ((local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
                       (local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar20)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
                    lVar14 = pTVar5[local_12b0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow;
                    if ((lVar14 <= lVar17) ||
                       (pTVar5[local_12b0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fCol <= lVar20)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    lVar14 = lVar14 * lVar20;
                    pdVar7 = pTVar5[local_12b0].super_TPZFMatrix<double>.fElem;
                    pdVar7[lVar14 + lVar17] =
                         local_10a0.fElem
                         [local_10a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar20 +
                          lVar19] * dVar1 + pdVar7[lVar14 + lVar17];
                    if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                      lVar14 = local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                               super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                               fRow;
                      if ((lVar14 <= lVar19) ||
                         (local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                          super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
                          <= lVar20)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if (((local_12d0 < 0) ||
                          ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                           super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= local_12d0)) ||
                         ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                          super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
                      lVar15 = pTVar5[local_12b0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow;
                      if ((lVar15 <= lVar17) ||
                         (pTVar5[local_12b0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= lVar20)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      lVar15 = lVar15 * lVar20;
                      pdVar7 = pTVar5[local_12b0].super_TPZFMatrix<double>.fElem;
                      pdVar7[lVar15 + lVar17] =
                           local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                           super_TPZFMatrix<double>.fElem[lVar14 * lVar20 + lVar19] * dVar1 *
                           (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.fElem
                           [local_12d0] + pdVar7[lVar15 + lVar17];
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 3);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                TPZManVector<double,_3>::~TPZManVector(local_1208);
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar8);
            }
            local_12b0 = local_12b0 + 1;
          } while (local_12b0 != 1);
          local_1298 = local_1298 + 1;
          local_12c0 = local_12c0 + 1;
          local_12d0 = local_12d0 + 1;
          local_1288 = local_1288 + 1;
          local_1260 = local_1260 + 8;
        } while (local_1288 != (uVar21 & 0xffffffff));
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != iVar9);
  }
  TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(&local_1010);
  TPZFMatrix<double>::~TPZFMatrix(&local_1150,&PTR_PTR_01845470);
  TPZFMatrix<double>::~TPZFMatrix(&local_10a0);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}